

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

Btree tree_5_3::search_2(Btree t,int e)

{
  bool bVar1;
  Btree local_20;
  Btree p;
  int e_local;
  Btree t_local;
  
  local_20 = t;
  while( true ) {
    bVar1 = false;
    if (local_20 != (Btree)0x0) {
      bVar1 = local_20->data != e;
    }
    if (!bVar1) break;
    if (e < local_20->data) {
      local_20 = local_20->left;
    }
    else {
      local_20 = local_20->right;
    }
  }
  return local_20;
}

Assistant:

Btree search_2(Btree t, int e) {
        Btree p = t;
        while (p != nullptr && p->data != e) {
            if (e < p->data)
                p = p->left;
            else
                p = p->right;
        }
        return p;
    }